

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O3

bool Assimp::PLY::ElementInstance::ParseInstance
               (char **pCur,Element *pcElement,ElementInstance *p_pcOut)

{
  iterator __position;
  bool bVar1;
  ValueUnion in_RAX;
  Logger *this;
  pointer prop;
  vector<Assimp::PLY::PropertyInstance::ValueUnion,std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>>
  *this_00;
  ValueUnion v;
  ValueUnion local_38;
  
  if (pcElement == (Element *)0x0) {
    __assert_fail("__null != pcElement",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyParser.cpp"
                  ,0x30a,
                  "static bool Assimp::PLY::ElementInstance::ParseInstance(const char *&, const PLY::Element *, PLY::ElementInstance *)"
                 );
  }
  if (p_pcOut != (ElementInstance *)0x0) {
    local_38 = in_RAX;
    std::vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>::
    resize(&p_pcOut->alProperties,
           ((long)(pcElement->alProperties).
                  super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(pcElement->alProperties).
                  super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
    this_00 = (vector<Assimp::PLY::PropertyInstance::ValueUnion,std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>>
               *)(p_pcOut->alProperties).
                 super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    if (this_00 !=
        (vector<Assimp::PLY::PropertyInstance::ValueUnion,std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>>
         *)(p_pcOut->alProperties).
           super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
      prop = (pcElement->alProperties).
             super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>.
             _M_impl.super__Vector_impl_data._M_start;
      do {
        bVar1 = PropertyInstance::ParseInstance(pCur,prop,(PropertyInstance *)this_00);
        if (!bVar1) {
          this = DefaultLogger::get();
          Logger::warn(this,"Unable to parse property instance. Skipping this element instance");
          if (prop->eType == EDT_Double) {
            local_38.fDouble = 0.0;
          }
          else {
            local_38.fDouble = local_38.fDouble & 0xffffffff00000000;
          }
          __position._M_current = *(ValueUnion **)(this_00 + 8);
          if (__position._M_current == *(ValueUnion **)(this_00 + 0x10)) {
            std::
            vector<Assimp::PLY::PropertyInstance::ValueUnion,std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>>
            ::_M_realloc_insert<Assimp::PLY::PropertyInstance::ValueUnion_const&>
                      (this_00,__position,&local_38);
          }
          else {
            *__position._M_current = local_38;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
          }
        }
        this_00 = this_00 + 0x18;
        prop = prop + 1;
      } while (this_00 !=
               (vector<Assimp::PLY::PropertyInstance::ValueUnion,std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>>
                *)(p_pcOut->alProperties).
                  super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
    }
    return true;
  }
  __assert_fail("__null != p_pcOut",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyParser.cpp"
                ,0x30b,
                "static bool Assimp::PLY::ElementInstance::ParseInstance(const char *&, const PLY::Element *, PLY::ElementInstance *)"
               );
}

Assistant:

bool PLY::ElementInstance::ParseInstance(const char* &pCur,
  const PLY::Element* pcElement,
  PLY::ElementInstance* p_pcOut)
{
  ai_assert(NULL != pcElement);
  ai_assert(NULL != p_pcOut);

  // allocate enough storage
  p_pcOut->alProperties.resize(pcElement->alProperties.size());

  std::vector<PLY::PropertyInstance>::iterator i = p_pcOut->alProperties.begin();
  std::vector<PLY::Property>::const_iterator  a = pcElement->alProperties.begin();
  for (; i != p_pcOut->alProperties.end(); ++i, ++a)
  {
    if (!(PLY::PropertyInstance::ParseInstance(pCur, &(*a), &(*i))))
    {
        ASSIMP_LOG_WARN("Unable to parse property instance. "
        "Skipping this element instance");

      PLY::PropertyInstance::ValueUnion v = PLY::PropertyInstance::DefaultValue((*a).eType);
      (*i).avList.push_back(v);
    }
  }
  return true;
}